

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O2

string * __thiscall
testing::internal::FormatFileLocation_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char *file,int line)

{
  string file_name;
  int local_94;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (this == (internal *)0x0) {
    this = (internal *)"unknown file";
  }
  local_94 = (int)file;
  std::__cxx11::string::string((string *)&local_70,(char *)this,(allocator *)&local_90);
  if ((int)file < 0) {
    std::operator+(__return_storage_ptr__,&local_70,":");
  }
  else {
    std::operator+(&local_30,&local_70,":");
    StreamableToString<int>(&local_50,&local_94);
    std::operator+(&local_90,&local_30,&local_50);
    std::operator+(__return_storage_ptr__,&local_90,":");
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
  std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

GTEST_API_ ::std::string FormatFileLocation(const char* file, int line) {
  const std::string file_name(file == nullptr ? kUnknownFile : file);

  if (line < 0) {
    return file_name + ":";
  }
#ifdef _MSC_VER
  return file_name + "(" + StreamableToString(line) + "):";
#else
  return file_name + ":" + StreamableToString(line) + ":";
#endif  // _MSC_VER
}